

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3rbu_step(sqlite3rbu *p)

{
  char **pzErrmsg;
  RbuObjIter *pIter;
  RbuUpdateStmt **ppRVar1;
  u8 uVar2;
  uchar uVar3;
  u32 uVar4;
  RbuFrame *pRVar5;
  sqlite3_file *psVar6;
  sqlite3_file *psVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uchar *__s2;
  char *pcVar11;
  RbuUpdateStmt *pRVar12;
  size_t sVar13;
  char *pcVar14;
  sqlite3_value *psVar15;
  Mem *pMVar16;
  RbuUpdateStmt **ppRVar17;
  char *pcVar18;
  int unaff_EBP;
  RbuUpdateStmt **ppRVar19;
  sqlite3_stmt *psVar20;
  long lVar21;
  char *zFmt;
  char *pcVar22;
  RbuUpdateStmt *pRVar23;
  uint uVar24;
  bool bVar25;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_50;
  int local_44;
  char *local_40;
  char *local_38;
  
  if (p == (sqlite3rbu *)0x0) {
    return 7;
  }
  iVar9 = p->eStage;
  if (iVar9 == 4) {
    if (p->rc != 0) goto LAB_00142de4;
    if (p->nStep < p->nFrame) {
      do {
        pRVar5 = p->aFrame;
        iVar9 = p->nStep;
        uVar4 = pRVar5[iVar9].iDbPage;
        uVar24 = p->nPagePerSector;
        psVar7 = p->pTargetFd->pReal;
        psVar6 = p->pTargetFd->pWalFd->pReal;
        iVar8 = (*psVar6->pMethods->xRead)
                          (psVar6,p->aBuf,p->pgsz,
                           ((long)p->pgsz + 0x18) * (ulong)(pRVar5[iVar9].iWalFrame - 1) + 0x38);
        p->rc = iVar8;
        if (iVar8 == 0) {
          iVar9 = (*psVar7->pMethods->xWrite)
                            (psVar7,p->aBuf,p->pgsz,
                             (ulong)(pRVar5[iVar9].iDbPage - 1) * (long)p->pgsz);
          p->rc = iVar9;
        }
        iVar9 = p->nStep;
        iVar8 = iVar9 + 1;
        p->nStep = iVar8;
      } while (((iVar8 < p->nFrame) &&
               ((uVar4 - 1) / uVar24 ==
                (p->aFrame[(long)iVar9 + 1].iDbPage - 1) / (uint)p->nPagePerSector)) && (p->rc == 0)
              );
    }
    else {
      psVar7 = p->pTargetFd->pReal;
      iVar9 = (*psVar7->pMethods->xSync)(psVar7,2);
      p->rc = iVar9;
      if (iVar9 == 0) {
        iVar9 = (*psVar7->pMethods->xShmMap)(psVar7,0,0x8000,0,&local_50);
        p->rc = iVar9;
        if (iVar9 == 0) {
          *(u32 *)(local_50 + 0x60) = p->iMaxFrame;
        }
      }
      if (p->rc == 0) {
        p->eStage = 5;
        p->rc = 0x65;
      }
    }
  }
  else {
    if (iVar9 != 2) {
      if (iVar9 == 1) {
        if (((p->zTarget == (char *)0x0) && (p->nProgress == 0)) && (p->rc == 0)) {
          rbuCreateTargetSchema(p);
          rbuCopyPragma(p,"user_version");
          rbuCopyPragma(p,"application_id");
        }
        bVar25 = p->rc == 0;
        if (bVar25) {
          pzErrmsg = &p->zErrmsg;
          if ((p->objiter).zTbl != (char *)0x0) {
            pIter = &p->objiter;
            pcVar11 = p->zStateDb;
            ppRVar1 = &(p->objiter).pRbuUpdate;
            local_38 = pcVar11;
            do {
              if ((p->objiter).bCleanup == 0) {
                rbuObjIterPrepareAll(p,pIter,0);
                if (p->rc == 0) {
                  local_44 = sqlite3_step((p->objiter).pSelect);
                  if (local_44 == 100) {
                    p->nProgress = p->nProgress + 1;
                    p->nStep = p->nStep + 1;
                    iVar9 = (p->objiter).nCol;
                    psVar20 = (p->objiter).pSelect;
                    pMVar16 = columnMem(psVar20,iVar9);
                    uVar2 = "\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05"
                            [pMVar16->flags & 0x1f];
                    columnMallocFailure(psVar20);
                    if (uVar2 == '\x03') {
                      __s2 = sqlite3_column_text((p->objiter).pSelect,iVar9);
                      uVar24 = 6;
                      if (__s2 == (uchar *)0x0) {
                        p->rc = 7;
                        goto LAB_00142780;
                      }
LAB_00142783:
                      bVar25 = false;
                    }
                    else {
                      bVar25 = true;
                      if (uVar2 == '\x01') {
                        psVar20 = (p->objiter).pSelect;
                        pMVar16 = columnMem(psVar20,iVar9);
                        uVar10 = sqlite3VdbeIntValue(pMVar16);
                        columnMallocFailure(psVar20);
                        switch(uVar10 & 0xffffffff) {
                        case 0:
                          uVar24 = 1;
                          break;
                        case 1:
                          uVar24 = 2;
                          break;
                        case 2:
                          uVar24 = 3;
                          break;
                        case 3:
                          uVar24 = 4;
                          break;
                        case 4:
                          uVar24 = 5;
                          break;
                        default:
                          goto switchD_00142715_default;
                        }
LAB_00142780:
                        __s2 = (uchar *)0x0;
                        goto LAB_00142783;
                      }
switchD_00142715_default:
                      __s2 = (uchar *)0x0;
                      uVar24 = 0;
                    }
                    if (bVar25) {
                      p->rc = 1;
                      pcVar11 = sqlite3_mprintf("invalid rbu_control value");
                      p->zErrmsg = pcVar11;
                    }
                    else {
                      pcVar11 = (p->objiter).zIdx;
                      if ((uVar24 & 0xfffffffe) == 4 && pcVar11 == (char *)0x0) {
                        p->rc = 1;
                        pcVar11 = sqlite3_mprintf("invalid rbu_control value");
                        p->zErrmsg = pcVar11;
                      }
                      else if (uVar24 == 6) {
                        p->nPhaseOneStep = p->nPhaseOneStep - (long)(p->objiter).nIndex;
                        pRVar23 = (p->objiter).pRbuUpdate;
                        if (pRVar23 == (RbuUpdateStmt *)0x0) {
                          bVar25 = false;
                          pRVar12 = (RbuUpdateStmt *)0x0;
LAB_001428d1:
                          ppRVar19 = ppRVar1;
                          if (bVar25) {
                            do {
                              ppRVar17 = ppRVar19;
                              pRVar23 = *ppRVar17;
                              ppRVar19 = &pRVar23->pNext;
                            } while (pRVar23 != pRVar12);
                            *ppRVar17 = (RbuUpdateStmt *)0x0;
                            sqlite3_finalize(pRVar12->pUpdate);
                            pRVar12->pUpdate = (sqlite3_stmt *)0x0;
                          }
                          else {
                            pRVar12 = (RbuUpdateStmt *)
                                      rbuMalloc(p,(long)(p->objiter).nTblCol + 0x19);
                          }
                          if (pRVar12 == (RbuUpdateStmt *)0x0) {
                            psVar20 = (sqlite3_stmt *)0x0;
                          }
                          else {
                            pcVar11 = rbuObjIterGetWhere(p,pIter);
                            if (p->rc == 0) {
                              sVar13 = strlen((char *)__s2);
                              iVar9 = (p->objiter).nTblCol;
                              if (iVar9 != (int)sVar13) {
                                p->rc = 1;
                                pcVar14 = sqlite3_mprintf("invalid rbu_control value");
                                p->zErrmsg = pcVar14;
                                goto LAB_00142a1a;
                              }
                              if (iVar9 < 1) goto LAB_00142a1a;
                              lVar21 = 0;
                              pcVar14 = (char *)0x0;
                              pcVar18 = "";
                              do {
                                uVar3 = __s2[(p->objiter).aiSrcOrder[lVar21]];
                                if (uVar3 == 'd') {
                                  pcVar22 = (p->objiter).azTblCol[lVar21];
                                  zFmt = "%z%s\"%w\"=rbu_delta(\"%w\", ?%d)";
LAB_001429d4:
                                  pcVar14 = rbuMPrintf(p,zFmt,pcVar14,pcVar18,pcVar22,pcVar22,
                                                       (int)lVar21 + 1);
LAB_001429e1:
                                  pcVar18 = ", ";
                                }
                                else {
                                  if (uVar3 == 'f') {
                                    pcVar22 = (p->objiter).azTblCol[lVar21];
                                    zFmt = "%z%s\"%w\"=rbu_fossil_delta(\"%w\", ?%d)";
                                    goto LAB_001429d4;
                                  }
                                  if (uVar3 == 'x') {
                                    pcVar14 = rbuMPrintf(p,"%z%s\"%w\"=?%d",pcVar14,pcVar18,
                                                         (p->objiter).azTblCol[lVar21],
                                                         (ulong)((int)lVar21 + 1));
                                    goto LAB_001429e1;
                                  }
                                }
                                lVar21 = lVar21 + 1;
                              } while (lVar21 < (p->objiter).nTblCol);
                            }
                            else {
LAB_00142a1a:
                              pcVar14 = (char *)0x0;
                            }
                            pRVar12->zMask = (char *)(pRVar12 + 1);
                            memcpy(pRVar12 + 1,__s2,(long)(p->objiter).nTblCol);
                            pRVar12->pNext = (p->objiter).pRbuUpdate;
                            (p->objiter).pRbuUpdate = pRVar12;
                            local_40 = pcVar14;
                            if (pcVar14 == (char *)0x0) {
                              psVar20 = (sqlite3_stmt *)0x0;
                            }
                            else {
                              pcVar18 = "rbu_imp_";
                              if ((p->objiter).eType == 5) {
                                pcVar18 = "";
                              }
                              pcVar14 = sqlite3_mprintf("UPDATE \"%s%w\" SET %s WHERE %s",pcVar18,
                                                        (p->objiter).zTbl,pcVar14,pcVar11);
                              iVar9 = prepareFreeAndCollectError
                                                (p->dbMain,&pRVar12->pUpdate,pzErrmsg,pcVar14);
                              p->rc = iVar9;
                              psVar20 = pRVar12->pUpdate;
                            }
                            sqlite3_free(pcVar11);
                            sqlite3_free(local_40);
                          }
                        }
                        else {
                          iVar9 = strcmp(pRVar23->zMask,(char *)__s2);
                          ppRVar19 = ppRVar1;
                          if (iVar9 != 0) {
                            uVar24 = 0;
                            do {
                              pRVar12 = pRVar23;
                              pRVar23 = pRVar12->pNext;
                              if (pRVar23 == (RbuUpdateStmt *)0x0) {
                                bVar25 = 0xe < uVar24;
                                goto LAB_001428d1;
                              }
                              uVar24 = uVar24 + 1;
                              iVar9 = strcmp(pRVar23->zMask,(char *)__s2);
                            } while (iVar9 != 0);
                            ppRVar19 = &pRVar12->pNext;
                          }
                          *ppRVar19 = pRVar23->pNext;
                          pRVar23->pNext = *ppRVar1;
                          *ppRVar1 = pRVar23;
                          psVar20 = pRVar23->pUpdate;
                        }
                        if (psVar20 != (sqlite3_stmt *)0x0) {
                          if (p->rc == 0) {
                            iVar9 = (p->objiter).nCol;
                            if (iVar9 < 1) {
                              bVar25 = true;
                            }
                            else {
                              lVar21 = 0;
                              do {
                                uVar3 = __s2[(p->objiter).aiSrcOrder[lVar21]];
                                psVar15 = sqlite3_column_value((p->objiter).pSelect,(int)lVar21);
                                if (((p->objiter).abTblPk[lVar21] != '\0') || (uVar3 != '.')) {
                                  iVar9 = sqlite3_bind_value(psVar20,(int)lVar21 + 1,psVar15);
                                  p->rc = iVar9;
                                }
                                bVar25 = p->rc == 0;
                                if (!bVar25) goto LAB_00142acd;
                                lVar21 = lVar21 + 1;
                                iVar9 = (p->objiter).nCol;
                              } while (lVar21 < iVar9);
                            }
                            if ((bVar25) && (((p->objiter).eType | 4U) == 5)) {
                              psVar15 = sqlite3_column_value((p->objiter).pSelect,iVar9 + 1);
                              iVar9 = sqlite3_bind_value(psVar20,(p->objiter).nCol + 1,psVar15);
                              p->rc = iVar9;
                            }
                          }
LAB_00142acd:
                          if (p->rc == 0) {
                            sqlite3_step(psVar20);
                            iVar9 = resetAndCollectError(psVar20,pzErrmsg);
                            p->rc = iVar9;
                          }
                        }
                      }
                      else {
                        if (uVar24 == 3) {
                          if (pcVar11 == (char *)0x0) {
                            p->nPhaseOneStep = p->nPhaseOneStep + (long)(p->objiter).nIndex;
                            rbuStepOneOp(p,2);
                          }
                          if (p->rc != 0) goto LAB_00142aee;
                          uVar24 = 1;
                        }
                        rbuStepOneOp(p,uVar24);
                      }
                    }
LAB_00142aee:
                    unaff_EBP = p->rc;
                    pcVar11 = local_38;
                  }
                  else {
                    iVar9 = sqlite3_reset((p->objiter).pSelect);
                    p->rc = iVar9;
                    p->nStep = 0;
                  }
                  if (local_44 == 100) {
                    bVar25 = true;
                    goto LAB_00142de0;
                  }
                }
              }
              else if ((p->zTarget != (char *)0x0) && ((p->objiter).abIndexed != (u8 *)0x0)) {
                rbuMPrintfExec(p,p->dbRbu,"DELETE FROM %s.\'rbu_tmp_%q\'",pcVar11,
                               (p->objiter).zDataTbl);
              }
              rbuObjIterNext(p,pIter);
              bVar25 = p->rc == 0;
              if (!bVar25) goto LAB_00142dde;
            } while ((p->objiter).zTbl != (char *)0x0);
          }
          if (bVar25) {
            rbuSaveState(p,2);
            if (p->rc == 0) {
              iVar9 = prepareAndCollectError
                                (*(sqlite3 **)
                                  (p->zStateDb + (ulong)(p->zTarget == (char *)0x0) * 8 + -0x28),
                                 &local_50,pzErrmsg,"PRAGMA schema_version");
              p->rc = iVar9;
              if (iVar9 == 0) {
                iVar9 = sqlite3_step(local_50);
                if (iVar9 == 100) {
                  pMVar16 = columnMem(local_50,0);
                  sqlite3VdbeIntValue(pMVar16);
                  columnMallocFailure(local_50);
                }
                rbuFinalize(p,local_50);
              }
              if (p->rc == 0) {
                rbuMPrintfExec(p,p->dbMain,"PRAGMA schema_version = %d");
              }
            }
            if (p->rc == 0) {
              iVar9 = sqlite3_exec(p->dbMain,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,pzErrmsg);
              p->rc = iVar9;
            }
            if (p->rc == 0) {
              iVar9 = sqlite3_exec(p->dbRbu,"COMMIT",(sqlite3_callback)0x0,(void *)0x0,pzErrmsg);
              p->rc = iVar9;
            }
            p->eStage = 2;
          }
LAB_00142dde:
          bVar25 = false;
        }
        else {
          bVar25 = false;
        }
LAB_00142de0:
        if (bVar25) {
          return unaff_EBP;
        }
      }
      goto LAB_00142de4;
    }
    if (p->rc != 0) goto LAB_00142de4;
    pcVar11 = sqlite3_db_filename(p->dbMain,"main");
    if (p->zTarget == (char *)0x0) {
      pcVar11 = sqlite3_db_filename(p->dbRbu,"main");
    }
    pcVar14 = sqlite3_mprintf("%s-oal",pcVar11);
    pcVar11 = sqlite3_mprintf("%s-wal",pcVar11);
    if (pcVar14 == (char *)0x0 || pcVar11 == (char *)0x0) {
      p->rc = 7;
    }
    else {
      psVar7 = p->pTargetFd->pReal;
      iVar9 = (*psVar7->pMethods->xLock)(psVar7,1);
      p->rc = iVar9;
      if (iVar9 == 0) {
        iVar9 = (*psVar7->pMethods->xLock)(psVar7,4);
        p->rc = iVar9;
      }
      if (p->rc == 0) {
        rbuObjIterFinalize(&p->objiter);
        sqlite3Close(p->dbRbu,0);
        sqlite3Close(p->dbMain,0);
        p->dbMain = (sqlite3 *)0x0;
        p->dbRbu = (sqlite3 *)0x0;
        iVar8 = rename(pcVar14,pcVar11);
        iVar9 = 10;
        if (iVar8 == 0) {
          iVar9 = 0;
        }
        p->rc = iVar9;
        if (iVar8 == 0) {
          rbuOpenDatabase(p,(int *)0x0);
          rbuSetupCheckpoint(p,(RbuState *)0x0);
        }
      }
    }
    sqlite3_free(pcVar11);
    sqlite3_free(pcVar14);
  }
  p->nProgress = p->nProgress + 1;
LAB_00142de4:
  return p->rc;
}

Assistant:

SQLITE_API int sqlite3rbu_step(sqlite3rbu *p){
  if( p ){
    switch( p->eStage ){
      case RBU_STAGE_OAL: {
        RbuObjIter *pIter = &p->objiter;

        /* If this is an RBU vacuum operation and the state table was empty
        ** when this handle was opened, create the target database schema. */
        if( rbuIsVacuum(p) && p->nProgress==0 && p->rc==SQLITE_OK ){
          rbuCreateTargetSchema(p);
          rbuCopyPragma(p, "user_version");
          rbuCopyPragma(p, "application_id");
        }

        while( p->rc==SQLITE_OK && pIter->zTbl ){

          if( pIter->bCleanup ){
            /* Clean up the rbu_tmp_xxx table for the previous table. It 
            ** cannot be dropped as there are currently active SQL statements.
            ** But the contents can be deleted.  */
            if( rbuIsVacuum(p)==0 && pIter->abIndexed ){
              rbuMPrintfExec(p, p->dbRbu, 
                  "DELETE FROM %s.'rbu_tmp_%q'", p->zStateDb, pIter->zDataTbl
              );
            }
          }else{
            rbuObjIterPrepareAll(p, pIter, 0);

            /* Advance to the next row to process. */
            if( p->rc==SQLITE_OK ){
              int rc = sqlite3_step(pIter->pSelect);
              if( rc==SQLITE_ROW ){
                p->nProgress++;
                p->nStep++;
                return rbuStep(p);
              }
              p->rc = sqlite3_reset(pIter->pSelect);
              p->nStep = 0;
            }
          }

          rbuObjIterNext(p, pIter);
        }

        if( p->rc==SQLITE_OK ){
          assert( pIter->zTbl==0 );
          rbuSaveState(p, RBU_STAGE_MOVE);
          rbuIncrSchemaCookie(p);
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, &p->zErrmsg);
          }
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, &p->zErrmsg);
          }
          p->eStage = RBU_STAGE_MOVE;
        }
        break;
      }

      case RBU_STAGE_MOVE: {
        if( p->rc==SQLITE_OK ){
          rbuMoveOalFile(p);
          p->nProgress++;
        }
        break;
      }

      case RBU_STAGE_CKPT: {
        if( p->rc==SQLITE_OK ){
          if( p->nStep>=p->nFrame ){
            sqlite3_file *pDb = p->pTargetFd->pReal;
  
            /* Sync the db file */
            p->rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
  
            /* Update nBackfill */
            if( p->rc==SQLITE_OK ){
              void volatile *ptr;
              p->rc = pDb->pMethods->xShmMap(pDb, 0, 32*1024, 0, &ptr);
              if( p->rc==SQLITE_OK ){
                ((u32 volatile*)ptr)[24] = p->iMaxFrame;
              }
            }
  
            if( p->rc==SQLITE_OK ){
              p->eStage = RBU_STAGE_DONE;
              p->rc = SQLITE_DONE;
            }
          }else{
            /* At one point the following block copied a single frame from the
            ** wal file to the database file. So that one call to sqlite3rbu_step()
            ** checkpointed a single frame. 
            **
            ** However, if the sector-size is larger than the page-size, and the
            ** application calls sqlite3rbu_savestate() or close() immediately
            ** after this step, then rbu_step() again, then a power failure occurs,
            ** then the database page written here may be damaged. Work around
            ** this by checkpointing frames until the next page in the aFrame[]
            ** lies on a different disk sector to the current one. */
            u32 iSector;
            do{
              RbuFrame *pFrame = &p->aFrame[p->nStep];
              iSector = (pFrame->iDbPage-1) / p->nPagePerSector;
              rbuCheckpointFrame(p, pFrame);
              p->nStep++;
            }while( p->nStep<p->nFrame 
                 && iSector==((p->aFrame[p->nStep].iDbPage-1) / p->nPagePerSector)
                 && p->rc==SQLITE_OK
            );
          }
          p->nProgress++;
        }
        break;
      }

      default:
        break;
    }
    return p->rc;
  }else{
    return SQLITE_NOMEM;
  }
}